

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void AGSSock::Socket_Close(Socket *sock)

{
  uint __i;
  int iVar1;
  long lVar2;
  int *piVar3;
  timeval timeout;
  fd_set read;
  
  if (sock->type == 1) {
    shutdown(sock->id,1);
    timeout.tv_sec = 0;
    timeout.tv_usec = 500;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      read.fds_bits[lVar2] = 0;
    }
    iVar1 = sock->id;
    read.fds_bits[iVar1 / 0x40] = read.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    iVar1 = select(iVar1 + 1,(fd_set *)&read,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    if (0 < iVar1) {
      return;
    }
  }
  Pool::remove(pool,(char *)sock);
  close(sock->id);
  sock->id = -1;
  piVar3 = __errno_location();
  sock->error = *piVar3;
  return;
}

Assistant:

void Socket_Close(Socket *sock)
{
	if (sock->type == SOCK_STREAM)
	{
		// Graceful shutdown, the poolthread will detect if it succeeded.
		shutdown(sock->id, SD_SEND);
		
		// Wait for a response to prevent race conditions
		fd_set read;
		timeval timeout = {0, 500}; // Half a second fudge time
		FD_ZERO(&read);
		
		FD_SET(sock->id, &read);
		if (select(sock->id + 1, &read, nullptr, nullptr, &timeout) > 0)
			return;
			
		// Select failed or timeout: we force close
	}
	
	// Invalidate socket
	pool->remove(sock);
	closesocket(sock->id);
	sock->id = INVALID_SOCKET;
	sock->error = GET_ERROR();
}